

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right_sequence.h
# Opt level: O3

int __thiscall
bk_lib::left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::copy
          (left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U> *this
          ,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint uVar1;
  buf_type *__dest;
  void *pvVar2;
  uint uVar3;
  
  uVar3 = (*(int *)(dst + 0xc) - *(int *)(dst + 0x10)) + (*(uint *)(dst + 8) & 0x7fffffff);
  if (uVar3 < 0x21) {
    __dest = &(this->super_type).
              super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
              field_0x14;
    uVar3 = 0x20;
  }
  else {
    uVar3 = uVar3 + 7;
    __dest = (buf_type *)operator_new((ulong)(uVar3 & 0xfffffff8));
    uVar3 = uVar3 & 0x7ffffff8 | 0x80000000;
  }
  (this->super_type).
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ = __dest;
  *(uint *)&(this->super_type).
            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
            field_0x8 = uVar3;
  uVar1 = *(uint *)(dst + 0xc);
  (this->super_type).
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ = uVar1;
  uVar3 = (uVar3 & 0x7fffffff) -
          ((*(uint *)(dst + 8) & 0x7fffffff) - *(int *)(dst + 0x10) & 0xfffffff8);
  (this->super_type).
  super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ = uVar3;
  if ((uVar1 == 0) && (*(uint *)(dst + 0x10) == (*(uint *)(dst + 8) & 0x7fffffff))) {
    return *(uint *)(dst + 8) & 0x7fffffff;
  }
  memcpy(__dest,*(void **)dst,(ulong)(uVar1 & 0xfffffffc));
  pvVar2 = memcpy(__dest + uVar3,(void *)((ulong)*(uint *)(dst + 0x10) + *(long *)dst),
                  (ulong)((*(uint *)(dst + 8) & 0x7fffffff) - *(uint *)(dst + 0x10) & 0xfffffff8));
  return (int)pvVar2;
}

Assistant:

void left_right_sequence<L, R, i>::copy(const left_right_sequence& other) {
	size_type os = other.raw_size();
	if ( os <= base_type::inline_raw_cap ) {
		this->buf_ = this->extra();
		this->cap_ = base_type::inline_raw_cap;
		this->free_= 0;
	}
	else {
		os         = ((os + (base_type::block_size-1)) / base_type::block_size) * base_type::block_size;
		this->buf_ = (buf_type*)::operator new(os*sizeof(buf_type));
		this->cap_ = os;
		this->free_= 1;
	}
	this->left_ = other.left_;
	this->right_= this->cap_ - (other.right_size()*sizeof(right_type));
	if (!other.empty()) {
		std::memcpy(this->begin(), other.begin(), other.left_size()*sizeof(left_type));
		std::memcpy(this->right(), const_cast<left_right_sequence&>(other).right(), other.right_size()*sizeof(right_type));
	}
}